

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O0

char * After_End_Of_Data(char *buf,int blen)

{
  bool bVar1;
  char *local_20;
  char *p;
  int blen_local;
  char *buf_local;
  
  local_20 = buf + blen;
  if ((buf != (char *)0x0) && (-1 < blen)) {
    while( true ) {
      bVar1 = false;
      if (buf < local_20) {
        bVar1 = local_20[-1] == ' ';
      }
      if (!bVar1) break;
      local_20 = local_20 + -1;
    }
    return local_20;
  }
  __assert_fail("buf && blen>=0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/micst[P]CMake/Source/CursesDialog/form/frm_driver.c"
                ,0xfb,"char *After_End_Of_Data(char *, int)");
}

Assistant:

INLINE static char *After_End_Of_Data(char * buf,int blen)
{
  char *p   = &buf[blen];
  
  assert(buf && blen>=0);
  while( (p>buf) && is_blank(p[-1]) ) 
    p--;
  return( p );
}